

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InlineeFrameInfo.h
# Opt level: O3

InlineeFrameRecord *
InlineeFrameRecord::New
          (Allocator *alloc,uint argCount,uint constantCount,intptr_t functionBodyAddr,
          InlineeFrameInfo *frameInfo)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  InlineeFrameRecord *pIVar4;
  undefined4 *puVar5;
  int *piVar6;
  Var *ppvVar7;
  
  pIVar4 = (InlineeFrameRecord *)
           new<NativeCodeData::AllocatorT<InlineeFrameRecord>>
                     (0x58,(AllocatorT<InlineeFrameRecord> *)alloc,0x55b468);
  pIVar4->argCount = argCount;
  (pIVar4->floatArgs).word = 0;
  (pIVar4->losslessInt32Args).word = 0;
  pIVar4->functionBody = (FunctionBody *)functionBodyAddr;
  pIVar4->frameInfo = frameInfo;
  BVar3 = ExceptionCheck::CanHandleOutOfMemory();
  if (BVar3 == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                       ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                       "ExceptionCheck::CanHandleOutOfMemory()");
    if (!bVar2) goto LAB_0055b465;
    *puVar5 = 0;
  }
  piVar6 = (int *)NativeCodeData::Allocator::Alloc(alloc,(ulong)argCount << 2);
  if (piVar6 == (int *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                       ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
    if (!bVar2) goto LAB_0055b465;
    *puVar5 = 0;
  }
  pIVar4->argOffsets = piVar6;
  BVar3 = ExceptionCheck::CanHandleOutOfMemory();
  if (BVar3 == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                       ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                       "ExceptionCheck::CanHandleOutOfMemory()");
    if (!bVar2) goto LAB_0055b465;
    *puVar5 = 0;
  }
  ppvVar7 = (Var *)NativeCodeData::Allocator::Alloc(alloc,(ulong)constantCount << 3);
  if (ppvVar7 == (Var *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                       ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
    if (!bVar2) {
LAB_0055b465:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  pIVar4->constants = ppvVar7;
  pIVar4->constantCount = constantCount;
  return pIVar4;
}

Assistant:

static InlineeFrameRecord* New(NativeCodeData::Allocator* alloc, uint argCount, uint constantCount, intptr_t functionBodyAddr, InlineeFrameInfo* frameInfo)
    {
        InlineeFrameRecord* record = NativeCodeDataNewZ(alloc, InlineeFrameRecord, argCount, (Js::FunctionBody*)functionBodyAddr, frameInfo);
        record->argOffsets = (int*)NativeCodeDataNewArrayNoFixup(alloc, IntType<DataDesc_InlineeFrameRecord_ArgOffsets>, argCount);
        record->constants = (Js::Var*)NativeCodeDataNewArrayNoFixup(alloc, VarType<DataDesc_InlineeFrameRecord_Constants>, constantCount);
        DebugOnly(record->constantCount = constantCount);
        return record;
    }